

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O3

void __thiscall bitfoot::Bitfoot::Evaluate(Bitfoot *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  size_type sVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  char *__function;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  uint64_t uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  ushort uVar34;
  undefined1 auVar39 [12];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  char cVar51;
  undefined1 auVar52 [12];
  undefined1 auVar55 [12];
  byte bVar68;
  char cVar69;
  byte bVar70;
  char cVar71;
  byte bVar72;
  char cVar73;
  byte bVar74;
  char cVar75;
  byte bVar76;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar54 [12];
  undefined1 auVar66 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [12];
  undefined1 auVar79 [12];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined4 uVar35;
  undefined6 uVar36;
  undefined8 uVar37;
  undefined1 auVar38 [12];
  undefined1 auVar40 [14];
  undefined1 auVar41 [14];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar53 [12];
  undefined1 auVar56 [14];
  undefined1 auVar57 [14];
  undefined1 auVar58 [14];
  undefined1 auVar59 [14];
  undefined1 auVar62 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar80 [14];
  undefined1 auVar81 [14];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  
  uVar11 = this->state;
  if ((uVar11 & 0x20) != 0) {
    __assert_fail("!(state & Draw)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0x6eb,"void bitfoot::Bitfoot::Evaluate()");
  }
  memset(this->pinfo,0,0x130);
  this->atkCount[0] = 0;
  this->atkCount[1] = 0;
  this->atkScore[0] = 0;
  this->atkScore[1] = 0;
  iVar8 = -_tempo;
  if ((uVar11 & 1) == 0) {
    iVar8 = _tempo;
  }
  iVar9 = this->material[0];
  iVar10 = this->material[1];
  iVar1 = this->sqrVal[0];
  iVar2 = this->sqrVal[1];
  iVar5 = GetPins<true>(this,6);
  iVar6 = GetPins<false>(this,6);
  if (this->pc[2] == 0) {
    iVar7 = -0x32;
  }
  else {
    iVar7 = PawnEval<false>(this);
  }
  iVar7 = ((iVar1 + iVar5 + iVar8 + iVar9) - (iVar10 + iVar2 + iVar6)) + iVar7;
  if (this->pc[3] == 0) {
    iVar7 = iVar7 + 0x32;
  }
  else {
    iVar8 = PawnEval<true>(this);
    iVar7 = iVar7 - iVar8;
  }
  if (this->pc[4] != 0) {
    iVar8 = KnightEval<false>(this);
    iVar7 = iVar7 + iVar8;
  }
  if (this->pc[5] != 0) {
    iVar8 = KnightEval<true>(this);
    iVar7 = iVar7 - iVar8;
  }
  if (this->pc[6] != 0) {
    iVar8 = BishopEval<false>(this);
    iVar7 = iVar7 + iVar8;
  }
  if (this->pc[7] != 0) {
    iVar8 = BishopEval<true>(this);
    iVar7 = iVar7 - iVar8;
  }
  if (this->pc[8] != 0) {
    iVar8 = RookEval<false>(this);
    iVar7 = iVar7 + iVar8;
  }
  if (this->pc[9] != 0) {
    iVar8 = RookEval<true>(this);
    iVar7 = iVar7 - iVar8;
  }
  if (this->pc[10] != 0) {
    iVar8 = QueenEval<false>(this);
    iVar7 = iVar7 + iVar8;
  }
  if (this->pc[0xb] != 0) {
    iVar8 = QueenEval<true>(this);
    iVar7 = iVar7 - iVar8;
  }
  uVar14 = this->atks[3];
  uVar30 = this->atks[5];
  uVar20 = this->atks[7];
  uVar15 = this->atks[9];
  uVar18 = this->atks[0xb];
  this->atks[0] = this->atks[10] | this->atks[8] | this->atks[6] | this->atks[4] | this->atks[2];
  this->atks[1] = uVar18 | uVar15 | uVar20 | uVar30 | uVar14;
  iVar8 = KingEval<false>(this);
  iVar9 = KingEval<true>(this);
  iVar9 = (iVar8 + iVar7) - iVar9;
  uVar14 = *(ulong *)(_KING_ATK + (long)this->king[0] * 8);
  this->atks[0xc] = uVar14;
  uVar18 = *(ulong *)(_KING_ATK + (long)this->king[1] * 8);
  this->atks[0xd] = uVar18;
  uVar20 = this->atks[3];
  uVar15 = this->atks[5];
  uVar30 = this->atks[7];
  uVar27 = this->atks[9];
  uVar3 = this->atks[0xb];
  this->atks[0] =
       uVar14 | this->atks[10] | this->atks[8] | this->atks[6] | this->atks[4] | this->atks[2];
  this->atks[1] = uVar18 | uVar3 | uVar27 | uVar30 | uVar15 | uVar20;
  if (this->pinfo[0].passed != 0) {
    iVar8 = PasserEval<false>(this);
    iVar9 = iVar9 + iVar8;
  }
  if (this->pinfo[1].passed != 0) {
    iVar8 = PasserEval<true>(this);
    iVar9 = iVar9 - iVar8;
  }
  VerifyPosition(this);
  uVar11 = this->state;
  if (((uVar11 & 0x20) == 0) && (this->rcount < 100)) {
    sVar13 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
             count((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   _seen,&this->positionKey);
    if (sVar13 == 0) {
      uVar14 = this->atks[0xd] | this->atks[0xc];
      uVar18 = uVar14 | 0x3c3c3c3c0000;
      auVar42._8_4_ = (int)uVar18;
      auVar42._0_8_ = uVar18;
      auVar42._12_4_ = (int)(uVar18 >> 0x20);
      auVar42 = auVar42 & *(undefined1 (*) [16])(this->atks + 10) |
                *(undefined1 (*) [16])(this->atks + 8) | *(undefined1 (*) [16])(this->atks + 6) |
                *(undefined1 (*) [16])(this->atks + 4) | *(undefined1 (*) [16])(this->atks + 2);
      uVar18 = auVar42._0_8_ - (auVar42._0_8_ >> 1 & 0x5555555555555555);
      uVar18 = (uVar18 >> 2 & 0x3333333333333333) + (uVar18 & 0x3333333333333333);
      uVar20 = auVar42._8_8_ - (auVar42._8_8_ >> 1 & 0x5555555555555555);
      uVar20 = (uVar20 >> 2 & 0x3333333333333333) + (uVar20 & 0x3333333333333333);
      auVar60 = _DAT_0013e060 & auVar42;
      auVar33._0_2_ = auVar60._0_2_ >> 1;
      auVar33._2_2_ = auVar60._2_2_ >> 1;
      auVar33._4_2_ = auVar60._4_2_ >> 1;
      auVar33._6_2_ = auVar60._6_2_ >> 1;
      auVar33._8_2_ = auVar60._8_2_ >> 1;
      auVar33._10_2_ = auVar60._10_2_ >> 1;
      auVar33._12_2_ = auVar60._12_2_ >> 1;
      auVar33._14_2_ = auVar60._14_2_ >> 1;
      auVar33 = auVar33 & _DAT_0013e070;
      uVar34 = CONCAT11(auVar60[1] - auVar33[1],auVar60[0] - auVar33[0]);
      uVar35 = CONCAT13(auVar60[3] - auVar33[3],CONCAT12(auVar60[2] - auVar33[2],uVar34));
      uVar36 = CONCAT15(auVar60[5] - auVar33[5],CONCAT14(auVar60[4] - auVar33[4],uVar35));
      uVar37 = CONCAT17(auVar60[7] - auVar33[7],CONCAT16(auVar60[6] - auVar33[6],uVar36));
      auVar52._0_10_ = CONCAT19(auVar60[9] - auVar33[9],CONCAT18(auVar60[8] - auVar33[8],uVar37));
      auVar52[10] = auVar60[10] - auVar33[10];
      auVar52[0xb] = auVar60[0xb] - auVar33[0xb];
      auVar56[0xc] = auVar60[0xc] - auVar33[0xc];
      auVar56._0_12_ = auVar52;
      auVar56[0xd] = auVar60[0xd] - auVar33[0xd];
      auVar83[0xe] = auVar60[0xe] - auVar33[0xe];
      auVar83._0_14_ = auVar56;
      auVar83[0xf] = auVar60[0xf] - auVar33[0xf];
      auVar33 = auVar83 & _DAT_0013e080;
      auVar61._0_2_ = uVar34 >> 2;
      auVar61._2_2_ = (ushort)((uint)uVar35 >> 0x12);
      auVar61._4_2_ = (ushort)((uint6)uVar36 >> 0x22);
      auVar61._6_2_ = (ushort)((ulong)uVar37 >> 0x32);
      auVar61._8_2_ = (ushort)((unkuint10)auVar52._0_10_ >> 0x42);
      auVar61._10_2_ = auVar52._10_2_ >> 2;
      auVar61._12_2_ = auVar56._12_2_ >> 2;
      auVar61._14_2_ = auVar83._14_2_ >> 2;
      auVar61 = auVar61 & _DAT_0013e080;
      cVar51 = auVar61[0] + auVar33[0];
      bVar68 = auVar61[1] + auVar33[1];
      uVar34 = CONCAT11(bVar68,cVar51);
      cVar69 = auVar61[2] + auVar33[2];
      bVar70 = auVar61[3] + auVar33[3];
      uVar35 = CONCAT13(bVar70,CONCAT12(cVar69,uVar34));
      cVar71 = auVar61[4] + auVar33[4];
      bVar72 = auVar61[5] + auVar33[5];
      uVar36 = CONCAT15(bVar72,CONCAT14(cVar71,uVar35));
      cVar73 = auVar61[6] + auVar33[6];
      bVar74 = auVar61[7] + auVar33[7];
      uVar37 = CONCAT17(bVar74,CONCAT16(cVar73,uVar36));
      cVar75 = auVar61[8] + auVar33[8];
      bVar76 = auVar61[9] + auVar33[9];
      auVar53._0_10_ = CONCAT19(bVar76,CONCAT18(cVar75,uVar37));
      auVar53[10] = auVar61[10] + auVar33[10];
      auVar53[0xb] = auVar61[0xb] + auVar33[0xb];
      auVar57[0xc] = auVar61[0xc] + auVar33[0xc];
      auVar57._0_12_ = auVar53;
      auVar57[0xd] = auVar61[0xd] + auVar33[0xd];
      auVar62[0xe] = auVar61[0xe] + auVar33[0xe];
      auVar62._0_14_ = auVar57;
      auVar62[0xf] = auVar61[0xf] + auVar33[0xf];
      auVar82[0] = (char)(uVar34 >> 4) + cVar51;
      auVar82[1] = (bVar68 >> 4) + bVar68;
      auVar82[2] = (char)(ushort)((uint)uVar35 >> 0x14) + cVar69;
      auVar82[3] = (bVar70 >> 4) + bVar70;
      auVar82[4] = (char)(ushort)((uint6)uVar36 >> 0x24) + cVar71;
      auVar82[5] = (bVar72 >> 4) + bVar72;
      auVar82[6] = (char)(ushort)((ulong)uVar37 >> 0x34) + cVar73;
      auVar82[7] = (bVar74 >> 4) + bVar74;
      auVar82[8] = (char)(ushort)((unkuint10)auVar53._0_10_ >> 0x44) + cVar75;
      auVar82[9] = (bVar76 >> 4) + bVar76;
      auVar82[10] = (char)(auVar53._10_2_ >> 4) + auVar53[10];
      auVar82[0xb] = (auVar53[0xb] >> 4) + auVar53[0xb];
      auVar82[0xc] = (char)(auVar57._12_2_ >> 4) + auVar57[0xc];
      auVar82[0xd] = (auVar57[0xd] >> 4) + auVar57[0xd];
      auVar82[0xe] = (char)(auVar62._14_2_ >> 4) + auVar62[0xe];
      auVar82[0xf] = (auVar62[0xf] >> 4) + auVar62[0xf];
      auVar83 = psadbw(auVar82 & _DAT_0013e090,(undefined1  [16])0x0);
      auVar84._8_4_ = (int)uVar14;
      auVar84._0_8_ = uVar14;
      auVar84._12_4_ = (int)(uVar14 >> 0x20);
      auVar84 = auVar84 & auVar42;
      auVar60._0_2_ = auVar84._0_2_ >> 1;
      auVar60._2_2_ = auVar84._2_2_ >> 1;
      auVar60._4_2_ = auVar84._4_2_ >> 1;
      auVar60._6_2_ = auVar84._6_2_ >> 1;
      auVar60._8_2_ = auVar84._8_2_ >> 1;
      auVar60._10_2_ = auVar84._10_2_ >> 1;
      auVar60._12_2_ = auVar84._12_2_ >> 1;
      auVar60._14_2_ = auVar84._14_2_ >> 1;
      auVar60 = auVar60 & _DAT_0013e070;
      uVar34 = CONCAT11(auVar84[1] - auVar60[1],auVar84[0] - auVar60[0]);
      uVar35 = CONCAT13(auVar84[3] - auVar60[3],CONCAT12(auVar84[2] - auVar60[2],uVar34));
      uVar36 = CONCAT15(auVar84[5] - auVar60[5],CONCAT14(auVar84[4] - auVar60[4],uVar35));
      uVar37 = CONCAT17(auVar84[7] - auVar60[7],CONCAT16(auVar84[6] - auVar60[6],uVar36));
      auVar78._0_10_ = CONCAT19(auVar84[9] - auVar60[9],CONCAT18(auVar84[8] - auVar60[8],uVar37));
      auVar78[10] = auVar84[10] - auVar60[10];
      auVar78[0xb] = auVar84[0xb] - auVar60[0xb];
      auVar80[0xc] = auVar84[0xc] - auVar60[0xc];
      auVar80._0_12_ = auVar78;
      auVar80[0xd] = auVar84[0xd] - auVar60[0xd];
      auVar85[0xe] = auVar84[0xe] - auVar60[0xe];
      auVar85._0_14_ = auVar80;
      auVar85[0xf] = auVar84[0xf] - auVar60[0xf];
      auVar33 = auVar85 & _DAT_0013e080;
      auVar86._0_2_ = uVar34 >> 2;
      auVar86._2_2_ = (ushort)((uint)uVar35 >> 0x12);
      auVar86._4_2_ = (ushort)((uint6)uVar36 >> 0x22);
      auVar86._6_2_ = (ushort)((ulong)uVar37 >> 0x32);
      auVar86._8_2_ = (ushort)((unkuint10)auVar78._0_10_ >> 0x42);
      auVar86._10_2_ = auVar78._10_2_ >> 2;
      auVar86._12_2_ = auVar80._12_2_ >> 2;
      auVar86._14_2_ = auVar85._14_2_ >> 2;
      auVar86 = auVar86 & _DAT_0013e080;
      cVar51 = auVar86[0] + auVar33[0];
      bVar68 = auVar86[1] + auVar33[1];
      uVar34 = CONCAT11(bVar68,cVar51);
      cVar69 = auVar86[2] + auVar33[2];
      bVar70 = auVar86[3] + auVar33[3];
      uVar35 = CONCAT13(bVar70,CONCAT12(cVar69,uVar34));
      cVar71 = auVar86[4] + auVar33[4];
      bVar72 = auVar86[5] + auVar33[5];
      uVar36 = CONCAT15(bVar72,CONCAT14(cVar71,uVar35));
      cVar73 = auVar86[6] + auVar33[6];
      bVar74 = auVar86[7] + auVar33[7];
      uVar37 = CONCAT17(bVar74,CONCAT16(cVar73,uVar36));
      cVar75 = auVar86[8] + auVar33[8];
      bVar76 = auVar86[9] + auVar33[9];
      auVar79._0_10_ = CONCAT19(bVar76,CONCAT18(cVar75,uVar37));
      auVar79[10] = auVar86[10] + auVar33[10];
      auVar79[0xb] = auVar86[0xb] + auVar33[0xb];
      auVar81[0xc] = auVar86[0xc] + auVar33[0xc];
      auVar81._0_12_ = auVar79;
      auVar81[0xd] = auVar86[0xd] + auVar33[0xd];
      auVar87[0xe] = auVar86[0xe] + auVar33[0xe];
      auVar87._0_14_ = auVar81;
      auVar87[0xf] = auVar86[0xf] + auVar33[0xf];
      auVar43[0] = (char)(uVar34 >> 4) + cVar51;
      auVar43[1] = (bVar68 >> 4) + bVar68;
      auVar43[2] = (char)(ushort)((uint)uVar35 >> 0x14) + cVar69;
      auVar43[3] = (bVar70 >> 4) + bVar70;
      auVar43[4] = (char)(ushort)((uint6)uVar36 >> 0x24) + cVar71;
      auVar43[5] = (bVar72 >> 4) + bVar72;
      auVar43[6] = (char)(ushort)((ulong)uVar37 >> 0x34) + cVar73;
      auVar43[7] = (bVar74 >> 4) + bVar74;
      auVar43[8] = (char)(ushort)((unkuint10)auVar79._0_10_ >> 0x44) + cVar75;
      auVar43[9] = (bVar76 >> 4) + bVar76;
      auVar43[10] = (char)(auVar79._10_2_ >> 4) + auVar79[10];
      auVar43[0xb] = (auVar79[0xb] >> 4) + auVar79[0xb];
      auVar43[0xc] = (char)(auVar81._12_2_ >> 4) + auVar81[0xc];
      auVar43[0xd] = (auVar81[0xd] >> 4) + auVar81[0xd];
      auVar43[0xe] = (char)(auVar87._14_2_ >> 4) + auVar87[0xe];
      auVar43[0xf] = (auVar87[0xf] >> 4) + auVar87[0xf];
      auVar33 = psadbw(auVar43 & _DAT_0013e090,(undefined1  [16])0x0);
      iVar8 = (iVar9 + (uint)(byte)(((uVar18 >> 4) + uVar18 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101
                                   >> 0x38) + auVar33._0_4_ + auVar83._0_4_) -
              ((uint)(byte)(((uVar20 >> 4) + uVar20 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38
                           ) + auVar33._8_4_ + auVar83._8_4_);
      uVar14 = this->pc[2];
      uVar18 = this->pc[4];
      uVar20 = this->pc[6];
      uVar30 = uVar20 | uVar18;
      uVar15 = (uVar30 | uVar14) & ~this->atks[0];
      if (uVar15 != 0) {
        uVar15 = uVar15 - (uVar15 >> 1 & 0x5555555555555555);
        uVar15 = (uVar15 >> 2 & 0x3333333333333333) + (uVar15 & 0x3333333333333333);
        iVar8 = iVar8 + (uint)(byte)(((uVar15 >> 4) + uVar15 & 0xf0f0f0f0f0f0f0f) *
                                     0x101010101010101 >> 0x38) * -6;
      }
      uVar15 = this->pc[3];
      uVar27 = this->pc[5];
      uVar3 = this->pc[7];
      uVar16 = uVar3 | uVar27;
      uVar17 = (uVar16 | uVar15) & ~this->atks[1];
      if (uVar17 != 0) {
        uVar17 = uVar17 - (uVar17 >> 1 & 0x5555555555555555);
        uVar17 = (uVar17 >> 2 & 0x3333333333333333) + (uVar17 & 0x3333333333333333);
        iVar8 = iVar8 + (uint)(byte)(((uVar17 >> 4) + uVar17 & 0xf0f0f0f0f0f0f0f) *
                                     0x101010101010101 >> 0x38) * 6;
      }
      uVar17 = uVar18 - (uVar18 >> 1 & 0x5555555555555555);
      uVar17 = (uVar17 >> 2 & 0x3333333333333333) + (uVar17 & 0x3333333333333333);
      uVar17 = ((uVar17 >> 4) + uVar17 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
      iVar9 = (uint)(byte)(uVar17 >> 0x38) * 0x10 + -0x10;
      if (uVar17 >> 0x38 < 2) {
        iVar9 = 0;
      }
      uVar17 = uVar27 - (uVar27 >> 1 & 0x5555555555555555);
      uVar17 = (uVar17 >> 2 & 0x3333333333333333) + (uVar17 & 0x3333333333333333);
      uVar17 = ((uVar17 >> 4) + uVar17 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
      iVar10 = (int)((uVar17 >> 0x38) << 4) + -0x10;
      if (uVar17 >> 0x38 < 2) {
        iVar10 = 0;
      }
      uVar11 = iVar10 + (iVar8 - iVar9);
      if (uVar15 == 0 && uVar14 == 0) {
        uVar26 = this->pc[8];
      }
      else {
        uVar12 = this->pinfo[0].count;
        uVar17 = uVar14 - (uVar14 >> 1 & 0x5555555555555555);
        uVar17 = (uVar17 >> 2 & 0x3333333333333333) + (uVar17 & 0x3333333333333333);
        if (uVar12 != (byte)(((uVar17 >> 4) + uVar17 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                            0x38)) {
          __assert_fail("pinfo[White].count == BitCount(pc[WhitePawn])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                        ,0x74a,"void bitfoot::Bitfoot::Evaluate()");
        }
        uVar25 = this->pinfo[1].count;
        uVar17 = uVar15 - (uVar15 >> 1 & 0x5555555555555555);
        uVar17 = (uVar17 >> 2 & 0x3333333333333333) + (uVar17 & 0x3333333333333333);
        if (uVar25 != (byte)(((uVar17 >> 4) + uVar17 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                            0x38)) {
          __assert_fail("pinfo[Black].count == BitCount(pc[BlackPawn])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                        ,0x74b,"void bitfoot::Bitfoot::Evaluate()");
        }
        uVar25 = uVar25 + uVar12;
        if (0x10 < uVar25) {
          __assert_fail("count <= 21",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                        ,0x757,"void bitfoot::Bitfoot::Evaluate()");
        }
        uVar23 = (uint)(byte)((char)uVar25 << 2) * 0x56 >> 8;
        auVar44._8_8_ = this->pinfo[1].behind;
        auVar44._0_8_ = this->pinfo[0].behind;
        auVar77._8_8_ = ~this->atks[0];
        auVar77._0_8_ = ~this->atks[1];
        auVar77 = auVar77 & auVar44;
        auVar45._0_8_ = auVar77._0_8_ >> 8;
        auVar45._8_8_ = auVar77._8_8_ >> 8;
        auVar45 = auVar45 & auVar77;
        auVar63._0_2_ = auVar45._0_2_ >> 1;
        auVar63._2_2_ = auVar45._2_2_ >> 1;
        auVar63._4_2_ = auVar45._4_2_ >> 1;
        auVar63._6_2_ = auVar45._6_2_ >> 1;
        auVar63._8_2_ = auVar45._8_2_ >> 1;
        auVar63._10_2_ = auVar45._10_2_ >> 1;
        auVar63._12_2_ = auVar45._12_2_ >> 1;
        auVar63._14_2_ = auVar45._14_2_ >> 1;
        auVar63 = auVar63 & _DAT_0013e070;
        uVar34 = CONCAT11(auVar45[1] - auVar63[1],auVar45[0] - auVar63[0]);
        uVar35 = CONCAT13(auVar45[3] - auVar63[3],CONCAT12(auVar45[2] - auVar63[2],uVar34));
        uVar36 = CONCAT15(auVar45[5] - auVar63[5],CONCAT14(auVar45[4] - auVar63[4],uVar35));
        uVar37 = CONCAT17(-auVar63[7],CONCAT16(auVar45[6] - auVar63[6],uVar36));
        auVar38._0_10_ = CONCAT19(auVar45[9] - auVar63[9],CONCAT18(auVar45[8] - auVar63[8],uVar37));
        auVar38[10] = auVar45[10] - auVar63[10];
        auVar38[0xb] = auVar45[0xb] - auVar63[0xb];
        auVar40[0xc] = auVar45[0xc] - auVar63[0xc];
        auVar40._0_12_ = auVar38;
        auVar40[0xd] = auVar45[0xd] - auVar63[0xd];
        auVar46[0xe] = auVar45[0xe] - auVar63[0xe];
        auVar46._0_14_ = auVar40;
        auVar46[0xf] = auVar45[0xf] - auVar63[0xf];
        auVar33 = auVar46 & _DAT_0013e080;
        auVar47._0_2_ = uVar34 >> 2;
        auVar47._2_2_ = (ushort)((uint)uVar35 >> 0x12);
        auVar47._4_2_ = (ushort)((uint6)uVar36 >> 0x22);
        auVar47._6_2_ = (ushort)((ulong)uVar37 >> 0x32);
        auVar47._8_2_ = (ushort)((unkuint10)auVar38._0_10_ >> 0x42);
        auVar47._10_2_ = auVar38._10_2_ >> 2;
        auVar47._12_2_ = auVar40._12_2_ >> 2;
        auVar47._14_2_ = auVar46._14_2_ >> 2;
        auVar47 = auVar47 & _DAT_0013e080;
        cVar51 = auVar47[0] + auVar33[0];
        bVar68 = auVar47[1] + auVar33[1];
        uVar34 = CONCAT11(bVar68,cVar51);
        cVar69 = auVar47[2] + auVar33[2];
        bVar70 = auVar47[3] + auVar33[3];
        uVar35 = CONCAT13(bVar70,CONCAT12(cVar69,uVar34));
        cVar71 = auVar47[4] + auVar33[4];
        bVar72 = auVar47[5] + auVar33[5];
        uVar36 = CONCAT15(bVar72,CONCAT14(cVar71,uVar35));
        cVar73 = auVar47[6] + auVar33[6];
        bVar74 = auVar47[7] + auVar33[7];
        uVar37 = CONCAT17(bVar74,CONCAT16(cVar73,uVar36));
        cVar75 = auVar47[8] + auVar33[8];
        bVar76 = auVar47[9] + auVar33[9];
        auVar39._0_10_ = CONCAT19(bVar76,CONCAT18(cVar75,uVar37));
        auVar39[10] = auVar47[10] + auVar33[10];
        auVar39[0xb] = auVar47[0xb] + auVar33[0xb];
        auVar41[0xc] = auVar47[0xc] + auVar33[0xc];
        auVar41._0_12_ = auVar39;
        auVar41[0xd] = auVar47[0xd] + auVar33[0xd];
        auVar48[0xe] = auVar47[0xe] + auVar33[0xe];
        auVar48._0_14_ = auVar41;
        auVar48[0xf] = auVar47[0xf] + auVar33[0xf];
        auVar64[0] = (char)(uVar34 >> 4) + cVar51;
        auVar64[1] = (bVar68 >> 4) + bVar68;
        auVar64[2] = (char)(ushort)((uint)uVar35 >> 0x14) + cVar69;
        auVar64[3] = (bVar70 >> 4) + bVar70;
        auVar64[4] = (char)(ushort)((uint6)uVar36 >> 0x24) + cVar71;
        auVar64[5] = (bVar72 >> 4) + bVar72;
        auVar64[6] = (char)(ushort)((ulong)uVar37 >> 0x34) + cVar73;
        auVar64[7] = (bVar74 >> 4) + bVar74;
        auVar64[8] = (char)(ushort)((unkuint10)auVar39._0_10_ >> 0x44) + cVar75;
        auVar64[9] = (bVar76 >> 4) + bVar76;
        auVar64[10] = (char)(auVar39._10_2_ >> 4) + auVar39[10];
        auVar64[0xb] = (auVar39[0xb] >> 4) + auVar39[0xb];
        auVar64[0xc] = (char)(auVar41._12_2_ >> 4) + auVar41[0xc];
        auVar64[0xd] = (auVar41[0xd] >> 4) + auVar41[0xd];
        auVar64[0xe] = (char)(auVar48._14_2_ >> 4) + auVar48[0xe];
        auVar64[0xf] = (auVar48[0xf] >> 4) + auVar48[0xf];
        auVar33 = psadbw((undefined1  [16])0x0,auVar64 & _DAT_0013e090);
        uVar12 = uVar23 * 4;
        uVar25 = uVar23;
        if (uVar18 == 0) {
          uVar25 = 0;
        }
        if (uVar27 == 0) {
          uVar23 = 0;
        }
        iVar8 = ((uVar25 + uVar11) - uVar23) + (auVar33._0_4_ - auVar33._8_4_) * 2;
        uVar11 = (uVar12 & 0xff) / 3;
        uVar26 = this->pc[8];
        iVar9 = (iVar8 - uVar11) + 0x1c;
        if (uVar26 == 0) {
          iVar9 = iVar8;
        }
        iVar8 = uVar11 - 0x1c;
        if (this->pc[9] == 0) {
          iVar8 = 0;
        }
        uVar11 = iVar8 + iVar9;
        uVar17 = this->pinfo[0].connected << 8 & this->pinfo[1].connected;
        if (((uVar17 != 0) && (uVar17 = (~uVar17 >> 1 | 0x80808080808080ff) & uVar17, uVar17 != 0))
           && (uVar17 = uVar17 - (uVar17 >> 1 & 0x5555555555555555),
              uVar17 = (uVar17 >> 2 & 0x3333333333333333) + (uVar17 & 0x3333333333333333),
              uVar17 = ((uVar17 >> 4) + uVar17 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101,
              2 < uVar17 >> 0x38)) {
          iVar9 = uVar11 * (10 - (uint)(byte)(uVar17 >> 0x38));
          iVar8 = iVar9 + 7;
          if (-1 < iVar9) {
            iVar8 = iVar9;
          }
          uVar11 = iVar8 >> 3;
        }
      }
      uVar24 = this->pc[0xc] ^ this->pc[0];
      uVar28 = uVar24 ^ uVar14;
      uVar17 = this->pc[10] | uVar26;
      if (uVar28 != (uVar17 | uVar30)) {
        __function = "uint64_t bitfoot::Bitfoot::MajorsAndMinors() const [color = false]";
LAB_0010a982:
        __assert_fail("(pc[color] ^ pc[color|Pawn] ^ pc[color|King]) == (MinorPieces<color>() | MajorPieces<color>())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                      ,0x294,__function);
      }
      uVar21 = this->pc[0xd] ^ this->pc[1];
      uVar22 = uVar21 ^ uVar15;
      uVar4 = this->pc[9];
      uVar29 = this->pc[0xb] | uVar4;
      if (uVar22 != (uVar29 | uVar16)) {
        __function = "uint64_t bitfoot::Bitfoot::MajorsAndMinors() const [color = true]";
        goto LAB_0010a982;
      }
      uVar19 = uVar20 - (uVar20 >> 1 & 0x5555555555555555);
      uVar19 = (uVar19 >> 2 & 0x3333333333333333) + (uVar19 & 0x3333333333333333);
      uVar19 = ((uVar19 >> 4) + uVar19 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
      bVar32 = true;
      bVar31 = true;
      if ((uVar19 >> 0x38 < 2 && (uVar17 == 0 && uVar14 == 0)) && (uVar18 == 0 || uVar20 == 0)) {
        uVar18 = uVar28 - (uVar28 >> 1 & 0x5555555555555555);
        uVar18 = (uVar18 >> 2 & 0x3333333333333333) + (uVar18 & 0x3333333333333333);
        bVar31 = 2 < (byte)(((uVar18 >> 4) + uVar18 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38
                           );
      }
      uVar18 = uVar3 - (uVar3 >> 1 & 0x5555555555555555);
      uVar18 = (uVar18 >> 2 & 0x3333333333333333) + (uVar18 & 0x3333333333333333);
      uVar18 = ((uVar18 >> 4) + uVar18 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
      if (((uVar18 >> 0x38 < 2 && (uVar29 == 0 && uVar15 == 0)) && (uVar27 == 0 || uVar3 == 0)) &&
         (uVar27 = uVar22 - (uVar22 >> 1 & 0x5555555555555555),
         uVar27 = (uVar27 >> 2 & 0x3333333333333333) + (uVar27 & 0x3333333333333333),
         bVar32 = 2 < (byte)(((uVar27 >> 4) + uVar27 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                            0x38), !bVar32 && bVar31 == false)) goto LAB_00109e2f;
      if (((0 < (int)uVar11 & (bVar31 ^ 1U)) == 0) && (-1 < (int)uVar11 || bVar32 != false)) {
        uVar12 = uVar11;
        if (uVar15 == 0 && uVar14 == 0) {
          auVar49._0_2_ = (ushort)uVar28 >> 1;
          auVar49._2_2_ = (ushort)(uVar28 >> 0x10) >> 1;
          auVar49._4_2_ = (ushort)(uVar28 >> 0x20) >> 1;
          auVar49._6_2_ = (ushort)(uVar28 >> 0x31);
          auVar49._8_2_ = (ushort)uVar22 >> 1;
          auVar49._10_2_ = (ushort)(uVar22 >> 0x10) >> 1;
          auVar49._12_2_ = (ushort)(uVar22 >> 0x20) >> 1;
          auVar49._14_2_ = (ushort)(uVar22 >> 0x31);
          auVar49 = auVar49 & _DAT_0013e070;
          uVar34 = CONCAT11((char)(uVar28 >> 8) - auVar49[1],(char)uVar28 - auVar49[0]);
          uVar35 = CONCAT13((char)(uVar28 >> 0x18) - auVar49[3],
                            CONCAT12((char)(uVar28 >> 0x10) - auVar49[2],uVar34));
          uVar36 = CONCAT15((char)(uVar28 >> 0x28) - auVar49[5],
                            CONCAT14((char)(uVar28 >> 0x20) - auVar49[4],uVar35));
          uVar37 = CONCAT17((char)(uVar28 >> 0x38) - auVar49[7],
                            CONCAT16((char)(uVar28 >> 0x30) - auVar49[6],uVar36));
          auVar54._0_10_ =
               CONCAT19((char)(uVar22 >> 8) - auVar49[9],CONCAT18((char)uVar22 - auVar49[8],uVar37))
          ;
          auVar54[10] = (char)(uVar22 >> 0x10) - auVar49[10];
          auVar54[0xb] = (char)(uVar22 >> 0x18) - auVar49[0xb];
          auVar58[0xc] = (char)(uVar22 >> 0x20) - auVar49[0xc];
          auVar58._0_12_ = auVar54;
          auVar58[0xd] = (char)(uVar22 >> 0x28) - auVar49[0xd];
          auVar65[0xe] = (char)(uVar22 >> 0x30) - auVar49[0xe];
          auVar65._0_14_ = auVar58;
          auVar65[0xf] = (char)(uVar22 >> 0x38) - auVar49[0xf];
          auVar33 = auVar65 & _DAT_0013e080;
          auVar66._0_2_ = uVar34 >> 2;
          auVar66._2_2_ = (ushort)((uint)uVar35 >> 0x12);
          auVar66._4_2_ = (ushort)((uint6)uVar36 >> 0x22);
          auVar66._6_2_ = (ushort)((ulong)uVar37 >> 0x32);
          auVar66._8_2_ = (ushort)((unkuint10)auVar54._0_10_ >> 0x42);
          auVar66._10_2_ = auVar54._10_2_ >> 2;
          auVar66._12_2_ = auVar58._12_2_ >> 2;
          auVar66._14_2_ = auVar65._14_2_ >> 2;
          auVar66 = auVar66 & _DAT_0013e080;
          cVar51 = auVar66[0] + auVar33[0];
          bVar68 = auVar66[1] + auVar33[1];
          uVar34 = CONCAT11(bVar68,cVar51);
          cVar69 = auVar66[2] + auVar33[2];
          bVar70 = auVar66[3] + auVar33[3];
          uVar35 = CONCAT13(bVar70,CONCAT12(cVar69,uVar34));
          cVar71 = auVar66[4] + auVar33[4];
          bVar72 = auVar66[5] + auVar33[5];
          uVar36 = CONCAT15(bVar72,CONCAT14(cVar71,uVar35));
          cVar73 = auVar66[6] + auVar33[6];
          bVar74 = auVar66[7] + auVar33[7];
          uVar37 = CONCAT17(bVar74,CONCAT16(cVar73,uVar36));
          cVar75 = auVar66[8] + auVar33[8];
          bVar76 = auVar66[9] + auVar33[9];
          auVar55._0_10_ = CONCAT19(bVar76,CONCAT18(cVar75,uVar37));
          auVar55[10] = auVar66[10] + auVar33[10];
          auVar55[0xb] = auVar66[0xb] + auVar33[0xb];
          auVar59[0xc] = auVar66[0xc] + auVar33[0xc];
          auVar59._0_12_ = auVar55;
          auVar59[0xd] = auVar66[0xd] + auVar33[0xd];
          auVar67[0xe] = auVar66[0xe] + auVar33[0xe];
          auVar67._0_14_ = auVar59;
          auVar67[0xf] = auVar66[0xf] + auVar33[0xf];
          auVar50[0] = (char)(uVar34 >> 4) + cVar51;
          auVar50[1] = (bVar68 >> 4) + bVar68;
          auVar50[2] = (char)(ushort)((uint)uVar35 >> 0x14) + cVar69;
          auVar50[3] = (bVar70 >> 4) + bVar70;
          auVar50[4] = (char)(ushort)((uint6)uVar36 >> 0x24) + cVar71;
          auVar50[5] = (bVar72 >> 4) + bVar72;
          auVar50[6] = (char)(ushort)((ulong)uVar37 >> 0x34) + cVar73;
          auVar50[7] = (bVar74 >> 4) + bVar74;
          auVar50[8] = (char)(ushort)((unkuint10)auVar55._0_10_ >> 0x44) + cVar75;
          auVar50[9] = (bVar76 >> 4) + bVar76;
          auVar50[10] = (char)(auVar55._10_2_ >> 4) + auVar55[10];
          auVar50[0xb] = (auVar55[0xb] >> 4) + auVar55[0xb];
          auVar50[0xc] = (char)(auVar59._12_2_ >> 4) + auVar59[0xc];
          auVar50[0xd] = (auVar59[0xd] >> 4) + auVar59[0xd];
          auVar50[0xe] = (char)(auVar67._14_2_ >> 4) + auVar67[0xe];
          auVar50[0xf] = (auVar67[0xf] >> 4) + auVar67[0xf];
          auVar33 = psadbw((undefined1  [16])0x0,auVar50 & _DAT_0013e090);
          uVar18 = auVar33._8_8_;
          if (uVar24 == uVar14) goto LAB_0010a8bb;
          if (((uVar21 != uVar15 && auVar33._0_8_ < 2) && uVar18 < 2) &&
             (((uVar28 == this->pc[10] && (uVar22 == uVar4)) ||
              ((uVar28 == uVar26 && (uVar22 == this->pc[0xb])))))) {
            uVar12 = uVar11 + 0x50;
            if (0 < (int)uVar11) {
              uVar12 = uVar11 - 0x50;
            }
            goto LAB_0010a683;
          }
          if (((uVar16 == uVar22 && uVar26 == uVar28) && auVar33._0_4_ < 2) && uVar18 < 3) {
            uVar25 = -uVar11;
            if (0 < (int)uVar11) {
              uVar25 = uVar11;
            }
            if (0xff < uVar25) goto LAB_0010a8bb;
            iVar9 = uVar25 * uVar11;
            iVar8 = iVar9 + 0xff;
            if (-1 < iVar9) {
              iVar8 = iVar9;
            }
LAB_0010a91c:
            uVar12 = iVar8 >> 8;
          }
          else {
LAB_0010a8bb:
            if ((((uVar28 == uVar30) && (uVar22 == uVar4)) && (uVar21 != uVar15)) &&
               ((uVar18 < 2 && (auVar33._0_8_ < 3)))) {
              uVar25 = -uVar11;
              if (0 < (int)uVar11) {
                uVar25 = uVar11;
              }
              if (uVar25 < 0x100) {
                iVar9 = uVar25 * uVar11;
                iVar8 = iVar9 + 0xff;
                if (-1 < iVar9) {
                  iVar8 = iVar9;
                }
                goto LAB_0010a91c;
              }
            }
          }
        }
        else {
          if ((uVar28 == uVar26) && (uVar22 == uVar4)) {
            uVar25 = -uVar11;
            if (0 < (int)uVar11) {
              uVar25 = uVar11;
            }
            if (uVar25 < 0x80) {
              iVar9 = uVar25 * uVar11;
              iVar8 = iVar9 + 0x7f;
              if (-1 < iVar9) {
                iVar8 = iVar9;
              }
              uVar12 = iVar8 >> 7;
              goto LAB_0010a683;
            }
          }
          if ((uVar28 == uVar20) && (uVar22 == uVar3)) {
            if ((uVar24 != uVar14) &&
               (((uVar20 & 0xaa55aa55aa55aa55) == 0) != ((uVar3 & 0xaa55aa55aa55aa55) == 0))) {
              uVar25 = -uVar11;
              if (0 < (int)uVar11) {
                uVar25 = uVar11;
              }
              if (((((byte)(uVar19 >> 0x38) < 2) && (uVar21 != uVar15)) &&
                  ((byte)(uVar18 >> 0x38) < 2)) && (uVar25 < 300)) {
                if ((int)uVar11 < 1) {
                  uVar26 = this->pinfo[1].connected;
                }
                else {
                  uVar26 = this->pinfo[0].connected;
                }
                if (uVar26 == 0) {
                  uVar11 = (int)uVar11 / 3;
                  uVar25 = -uVar11;
                  if (0 < (int)uVar11) {
                    uVar25 = uVar11;
                  }
                }
                uVar12 = (int)(uVar25 * uVar11) / 300;
              }
            }
          }
        }
      }
      else {
        if (bVar31 == bVar32) {
          __assert_fail("whiteCanWin != blackCanWin",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                        ,0x786,"void bitfoot::Bitfoot::Evaluate()");
        }
        uVar12 = -uVar11;
        if (0 < (int)uVar11) {
          uVar12 = uVar11;
        }
        if (999 < uVar12) {
          __assert_fail("abs(eval) < 1000",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                        ,0x787,"void bitfoot::Bitfoot::Evaluate()");
        }
        iVar9 = (int)(uVar12 * uVar11) >> 0x1f;
        iVar8 = (int)(uVar12 * uVar11) / 1000 + iVar9;
        uVar12 = (iVar8 + -0x32) - iVar9;
        if (bVar31 != false) {
          uVar12 = (iVar8 + 0x32) - iVar9;
        }
      }
LAB_0010a683:
      uVar11 = -uVar12;
      if (0 < (int)uVar12) {
        uVar11 = uVar12;
      }
      if ((0x19 < this->rcount) && (8 < uVar11)) {
        uVar12 = (uint)((25.0 / (double)this->rcount) * (double)(int)uVar12);
      }
      uVar11 = -uVar12;
      if ((this->state & 1) == 0) {
        uVar11 = uVar12;
      }
      goto LAB_00109e4d;
    }
LAB_00109e2f:
    uVar11 = this->state;
  }
  this->state = uVar11 | 0x20;
  uVar11 = (&_drawScore)[uVar11 & 1];
LAB_00109e4d:
  this->standPat = uVar11;
  return;
}

Assistant:

void Evaluate() {
#ifndef NDEBUG
    assert(!(state & Draw));
    memset(&evals, 0, sizeof(evals));
#endif
    memset(pinfo, 0, sizeof(pinfo));
    memset(atks, 0, sizeof(atks));
    atkCount[White] = 0;
    atkCount[Black] = 0;
    atkScore[White] = 0;
    atkScore[Black] = 0;

    // evaluate from white's perspective
    int eval = ((ColorToMove() ? -_tempo : _tempo) +
                material[White] -
                material[Black] +
                sqrVal[White] -
                sqrVal[Black] +
                GetPins<Black>(6) -
                GetPins<White>(6));

    // no pawns = bad
    if (pc[WhitePawn])   eval += PawnEval<White>(); else eval -= 50;
    if (pc[BlackPawn])   eval -= PawnEval<Black>(); else eval += 50;
    if (pc[WhiteKnight]) eval += KnightEval<White>();
    if (pc[BlackKnight]) eval -= KnightEval<Black>();
    if (pc[WhiteBishop]) eval += BishopEval<White>();
    if (pc[BlackBishop]) eval -= BishopEval<Black>();
    if (pc[WhiteRook])   eval += RookEval<White>();
    if (pc[BlackRook])   eval -= RookEval<Black>();
    if (pc[WhiteQueen])  eval += QueenEval<White>();
    if (pc[BlackQueen])  eval -= QueenEval<Black>();

    // fill in attack bitmaps sans king attacks
    atks[White] = (atks[WhitePawn] | atks[WhiteKnight] | atks[WhiteBishop] |
                   atks[WhiteRook] | atks[WhiteQueen]);
    atks[Black] = (atks[BlackPawn] | atks[BlackKnight] | atks[BlackBishop] |
                   atks[BlackRook] | atks[BlackQueen]);

    eval += KingEval<White>();
    eval -= KingEval<Black>();

    // finish populating attack bitmaps
    atks[WhiteKing] = _KING_ATK[king[White]];
    atks[BlackKing] = _KING_ATK[king[Black]];
    atks[White] = (atks[WhitePawn] | atks[WhiteKnight] | atks[WhiteBishop] |
                   atks[WhiteRook] | atks[WhiteQueen]  | atks[WhiteKing]);
    atks[Black] = (atks[BlackPawn] | atks[BlackKnight] | atks[BlackBishop] |
                   atks[BlackRook] | atks[BlackQueen]  | atks[BlackKing]);

    // now that attack bitmaps are complete evaluate passed pawns
    if (pinfo[White].passed) eval += PasserEval<White>();
    if (pinfo[Black].passed) eval -= PasserEval<Black>();

#ifndef NDEBUG
    VerifyPosition();
#endif

    // NOTE: if draw due to rcount this destabilizes the transposition table
    //       because rcount is not encoded into positionKey
    if (IsDraw()) {
      state |= Draw;
      standPat = _drawScore[ColorToMove()];
      return;
    }

    // TODO use specialized eval function for particular piece configurations

    // bonus for board coverage
    uint64_t x;
    x = (atks[WhitePawn]|atks[WhiteKnight]|atks[WhiteBishop]|atks[WhiteRook]|
         (atks[WhiteQueen] & (_CENTER16|atks[WhiteKing]|atks[BlackKing])));
    eval += (BitCount(x) + BitCount(x & _CENTER4) +
             BitCount(x & (atks[WhiteKing]|atks[BlackKing])));
    x = (atks[BlackPawn]|atks[BlackKnight]|atks[BlackBishop]|atks[BlackRook]|
         (atks[BlackQueen] & (_CENTER16|atks[WhiteKing]|atks[BlackKing])));
    eval -= (BitCount(x) + BitCount(x & _CENTER4) +
             BitCount(x & (atks[WhiteKing]|atks[BlackKing])));

    // penalty for unprotected pawns, knights, and bishops
    if ((x = ((pc[WhitePawn]|MinorPieces<White>()) & ~atks[White]))) {
      eval -= (6 * BitCount(x));
    }
    if ((x = ((pc[BlackPawn]|MinorPieces<Black>()) & ~atks[Black]))) {
      eval += (6 * BitCount(x));
    }

    // redundant knights are worth slightly less
    if (MULTI_BIT(pc[WhiteKnight])) {
      eval -= (16 * (BitCount(pc[WhiteKnight]) - 1));
    }
    if (MULTI_BIT(pc[BlackKnight])) {
      eval += (16 * (BitCount(pc[BlackKnight]) - 1));
    }

    // are there any pawns on the board?
    if (pc[WhitePawn] || pc[BlackPawn]) {
      assert(pinfo[White].count == BitCount(pc[WhitePawn]));
      assert(pinfo[Black].count == BitCount(pc[BlackPawn]));

      // bonus for uncontested contiguous vertical space behind connected pawns
      x = (pinfo[White].behind & ~atks[Black]);
      x &= (x >> 8);
      eval += (2 * BitCount(x));
      x = (pinfo[Black].behind & ~atks[White]);
      x &= (x >> 8);
      eval -= (2 * BitCount(x));

      // increase value of 1 knight relative to # of pawns on the board
      int count = ((4 * (pinfo[White].count + pinfo[Black].count)) / 3);
      assert(count <= 21);
      if (pc[WhiteKnight]) {
        eval += count;
      }
      if (pc[BlackKnight]) {
        eval -= count;
      }

      // increase value of 1 rook as pawns come off the board
      count = ((4 * count) / 3); // inflate pawn count a bit more
      assert(count <= 28);
      if (pc[WhiteRook]) {
        eval += (28 - count);
      }
      if (pc[BlackRook]) {
        eval -= (28 - count);
      }

      // reduce winning score relative to number of locked pawns
      if ((x = ((pinfo[White].connected << North) & pinfo[Black].connected))) {
        if ((x &= ~((x & ~_FILE[0]) >> 1))) {
          if ((count = BitCount(x)) > 2) {
            eval = ((eval * (10 - count)) / 8);
          }
        }
      }
    }

    // draw due to lack of mating material?
    const uint64_t whitePcs = MajorsAndMinors<White>();
    const uint64_t blackPcs = MajorsAndMinors<Black>();
    const bool whiteCanWin  = (pc[WhitePawn] || pc[WhiteRook] ||
                               pc[WhiteQueen] || MULTI_BIT(pc[WhiteBishop]) ||
                               (pc[WhiteKnight] && pc[WhiteBishop]) ||
                               (BitCount(whitePcs) > 2));
    const bool blackCanWin  = (pc[BlackPawn] || pc[BlackRook] ||
                               pc[BlackQueen] || MULTI_BIT(pc[BlackBishop]) ||
                               (pc[BlackKnight] && pc[BlackBishop]) ||
                               (BitCount(blackPcs) > 2));
    if (!whiteCanWin && !blackCanWin) {
      state |= Draw;
      standPat = _drawScore[ColorToMove()];
      return;
    }

    // reduce winning score if "winning" side can't win
    if (((eval > 0) && !whiteCanWin) || ((eval < 0) && !blackCanWin)) {
      assert(whiteCanWin != blackCanWin);
      assert(abs(eval) < 1000);
      eval = ((eval * abs(eval)) / 1000);
      eval += (whiteCanWin ? 50 : -50);
    }

    else if (!pc[WhitePawn] && !pc[BlackPawn]) {
      // reduce winning score if Q vs R
      if (SINGLE_BIT(whitePcs) && SINGLE_BIT(blackPcs) &&
          (((whitePcs == pc[WhiteQueen]) && (blackPcs == pc[BlackRook])) ||
           ((blackPcs == pc[BlackQueen]) && (whitePcs == pc[WhiteRook]))))
      {
        eval -= ((eval > 0) ? 80 : -80);
      }

      // reduce winning score if R vs minor(s)
      else if (SINGLE_BIT(whitePcs) && (whitePcs == pc[WhiteRook]) &&
               (blackPcs == MinorPieces<Black>()) &&
               (BitCount(blackPcs) <= 2) && (abs(eval) < 256))
      {
        eval = ((eval * abs(eval)) / 256);
      }
      else if (SINGLE_BIT(blackPcs) && (blackPcs == pc[BlackRook]) &&
               (whitePcs == MinorPieces<White>()) &&
               (BitCount(whitePcs) <= 2) && (abs(eval) < 256))
      {
        eval = ((eval * abs(eval)) / 256);
      }
    }

    // reduce winning score if pawns + R vs R ending
    else if ((whitePcs == pc[WhiteRook]) && (blackPcs == pc[BlackRook]) &&
             (abs(eval) < 128))
    {
      eval = ((eval * abs(eval)) / 128);
    }

    // reduce winning score if pawns + opposite color bishop ending
    else if ((whitePcs == pc[WhiteBishop]) && (blackPcs == pc[BlackBishop]) &&
             (!(whitePcs & _LIGHT) != !(blackPcs & _LIGHT)) &&
             SINGLE_BIT(whitePcs) && SINGLE_BIT(blackPcs) &&
             (abs(eval) < 300))
    {
      if ((eval > 0) ? !pinfo[White].connected : !pinfo[Black].connected) {
        eval /= 3;
      }
      eval = ((eval * abs(eval)) / 300);
    }

    // reduce winning score if rcount is getting large
    // NOTE: this destabilizes transposition table values
    //       because rcount is not encoded into positionKey
    if ((rcount > 25) && (abs(eval) > 8)) {
      eval = static_cast<int>(eval * (25.0 / rcount));
    }

    // standPat is eval from persepctive of the side to move
    standPat = (ColorToMove() ? -eval : eval);
  }